

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  allocator<char> local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,(test_property->key_)._M_dataplus._M_p,&local_91);
  GetReservedAttributesForElement(&local_90,xml_element);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_90.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_90.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  pbVar1 = local_90.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = local_90.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current !=
      local_90.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0.ptr_ + 0x10),"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0.ptr_ + 0x10),(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_a0.ptr_ + 0x10)," (",2);
    local_78 = pbVar1;
    Message::Message((Message *)&local_a8);
    if ((long)local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar3 = (long)local_90.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_90.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar4 = 8;
      uVar5 = 0;
      do {
        if (2 < uVar3 && uVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_a8.data_)->line,", ",2);
        }
        if (uVar5 == ((long)local_90.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_90.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_a8.data_)->line,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,"\'",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,
                   *(char **)((long)local_90.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8),
                   *(long *)((long)&((local_90.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a8.data_)->line,"\'",1);
        uVar5 = uVar5 + 1;
        uVar3 = (long)local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar4 = lVar4 + 0x20;
      } while (uVar5 < uVar3);
    }
    internal::StringStreamToString(&local_50,(stringstream *)local_a8.data_);
    if (local_a8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8.data_ + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0.ptr_ + 0x10),local_50._M_dataplus._M_p,local_50._M_string_length
              );
    pbVar6 = local_78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0.ptr_ + 0x10)," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a0.ptr_ + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_a0.ptr_ + 0x10),")",1);
    internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/gtest/src/gtest-all.cc"
               ,0xe3a,"Failed");
    internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0.ptr_ + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return _Var2._M_current == pbVar6;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}